

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

char * append_str(char *zText,int n,int p1,int p2,int bNoSubst)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  char *__dest;
  int iVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  char zInt [40];
  char local_58 [40];
  
  pcVar9 = append_str::z;
  if (zText == (char *)0x0) {
    if (append_str::z != (char *)0x0 && append_str::used == 0) {
      *append_str::z = '\0';
    }
    append_str::used = 0;
  }
  else {
    sVar2 = (size_t)(uint)n;
    if (n < 1) {
      if ((n < 0) && (append_str::used = append_str::used + n, append_str::used < 0)) {
        __assert_fail("used>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                      ,0xdc3,"char *append_str(const char *, int, int, int, int)");
      }
      sVar2 = strlen(zText);
    }
    uVar5 = (ulong)append_str::used;
    uVar3 = (long)(int)sVar2 + uVar5 + 0x50;
    if ((ulong)(long)append_str::alloced <= uVar3) {
      append_str::alloced = (int)uVar3 + 200;
      append_str::z = (char *)realloc(append_str::z,(long)append_str::alloced);
    }
    pcVar9 = append_str::z;
    if (append_str::z != (char *)0x0) {
      do {
        iVar4 = (int)uVar5;
        iVar1 = (int)sVar2;
        iVar6 = 0;
        lVar8 = 0;
        while( true ) {
          if (iVar1 + iVar6 < 1) {
            pcVar9[lVar8 + iVar4] = '\0';
            return pcVar9;
          }
          iVar7 = (int)lVar8;
          if ((((iVar1 + -1 != iVar7) && (bNoSubst == 0)) && (zText[lVar8] == '%')) &&
             (zText[lVar8 + 1] == 'd')) break;
          append_str::used = iVar4 + 1 + iVar7;
          pcVar9[lVar8 + iVar4] = zText[lVar8];
          lVar8 = lVar8 + 1;
          iVar6 = iVar6 + -1;
        }
        sprintf(local_58,"%d",p1);
        iVar4 = append_str::used;
        pcVar9 = append_str::z;
        __dest = append_str::z + append_str::used;
        strcpy(__dest,local_58);
        sVar2 = strlen(__dest);
        append_str::used = (int)sVar2 + iVar4;
        uVar5 = (ulong)(uint)append_str::used;
        zText = zText + lVar8 + 2;
        sVar2 = (size_t)((iVar1 - iVar7) - 2);
        p1 = p2;
      } while( true );
    }
    pcVar9 = append_str::empty;
  }
  return pcVar9;
}

Assistant:

PRIVATE char *append_str(const char *zText, int n, int p1, int p2, int bNoSubst){
  static char empty[1] = { 0 };
  static char *z = 0;
  static int alloced = 0;
  static int used = 0;
  int c;
  char zInt[40];
  if( zText==0 ){
    if( used==0 && z!=0 ) z[0] = 0;
    used = 0;
    return z;
  }
  if( n<=0 ){
    if( n<0 ){
      used += n;
      assert( used>=0 );
    }
    n = lemonStrlen(zText);
  }
  if( n+sizeof(zInt)*2+used >= (size_t)alloced ){
    alloced = n + sizeof(zInt)*2 + used + 200;
    z = (char *) realloc(z,  alloced);
  }
  if( z==0 ) return empty;
  while( n-- > 0 ){
    c = *(zText++);
    if( !bNoSubst && c=='%' && n>0 && zText[0]=='d' ){
      sprintf(zInt, "%d", p1);
      p1 = p2;
      strcpy(&z[used], zInt);
      used += lemonStrlen(&z[used]);
      zText++;
      n--;
    }else{
      z[used++] = c;
    }
  }
  z[used] = 0;
  return z;
}